

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Voice::tick(V2Voice *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  V2Voice *this_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    V2Env::tick(this->env + local_14,(bool)(this->gate & 1));
  }
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    V2LFO::tick(this->lfo + local_18);
  }
  this->volramp = (this->env[0].out / 128.0 - this->curvol) * this->inst->SRfciframe;
  return;
}

Assistant:

void tick()
    {
        for (int i=0; i < syVV2::NENV; i++)
            env[i].tick(gate);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].tick();

        // volume ramping slope
        volramp = (env[0].out / 128.0f - curvol) * inst->SRfciframe;
        DEBUG_PLOT_VAL(&curvol, curvol);
    }